

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlskey_openssl.cpp
# Opt level: O1

TlsKeyOpenSSL * QTlsPrivate::TlsKeyOpenSSL::publicKeyFromX509(X509 *x)

{
  int iVar1;
  TlsKeyOpenSSL *this;
  EVP_PKEY *pkey;
  RSA *pRVar2;
  KeyAlgorithm KVar3;
  
  this = (TlsKeyOpenSSL *)operator_new(0x20);
  (this->super_TlsKeyBase).keyIsNull = true;
  (this->super_TlsKeyBase).keyType = PublicKey;
  (this->super_TlsKeyBase).keyAlgorithm = Opaque;
  *(undefined ***)&this->super_TlsKeyBase = &PTR__TlsKeyOpenSSL_0014d4d0;
  (this->field_0).opaque = (EVP_PKEY *)0x0;
  clear(this,false);
  (this->super_TlsKeyBase).keyType = PublicKey;
  pkey = q_X509_get_pubkey(x);
  iVar1 = q_EVP_PKEY_get_base_id(pkey);
  iVar1 = q_EVP_PKEY_type(iVar1);
  if (iVar1 == 0x198) {
    pRVar2 = (RSA *)q_EVP_PKEY_get1_EC_KEY(pkey);
    KVar3 = Ec;
  }
  else if (iVar1 == 0x74) {
    pRVar2 = (RSA *)q_EVP_PKEY_get1_DSA(pkey);
    KVar3 = Dsa;
  }
  else {
    if (iVar1 != 6) goto LAB_001253d4;
    pRVar2 = q_EVP_PKEY_get1_RSA(pkey);
    KVar3 = Rsa;
  }
  (this->field_0).rsa = pRVar2;
  (this->super_TlsKeyBase).keyAlgorithm = KVar3;
  (this->super_TlsKeyBase).keyIsNull = false;
LAB_001253d4:
  q_EVP_PKEY_free(pkey);
  return this;
}

Assistant:

TlsKeyOpenSSL *TlsKeyOpenSSL::publicKeyFromX509(X509 *x)
{
    TlsKeyOpenSSL *tlsKey = new TlsKeyOpenSSL;
    std::unique_ptr<TlsKeyOpenSSL> keyRaii(tlsKey);

    tlsKey->keyType = QSsl::PublicKey;

#ifndef OPENSSL_NO_DEPRECATED_3_0

#define get_pubkey(keyName, alg) tlsKey->keyName = q_EVP_PKEY_get1_##alg(pkey)

#else

#define get_pubkey(a, b) tlsKey->genericKey = pkey

#endif

    EVP_PKEY *pkey = q_X509_get_pubkey(x);
    Q_ASSERT(pkey);
    const int keyType = q_EVP_PKEY_type(q_EVP_PKEY_base_id(pkey));

    if (keyType == EVP_PKEY_RSA) {
        get_pubkey(rsa, RSA);
        tlsKey->keyAlgorithm = QSsl::Rsa;
        tlsKey->keyIsNull = false;
    } else if (keyType == EVP_PKEY_DSA) {
        get_pubkey(dsa, DSA);
        tlsKey->keyAlgorithm = QSsl::Dsa;
        tlsKey->keyIsNull = false;
#ifndef OPENSSL_NO_EC
    } else if (keyType == EVP_PKEY_EC) {
        get_pubkey(ec, EC_KEY);
        tlsKey->keyAlgorithm = QSsl::Ec;
        tlsKey->keyIsNull = false;
#endif
    } else if (keyType == EVP_PKEY_DH) {
        // DH unsupported (key is null)
    } else {
        // error? (key is null)
    }

#ifndef OPENSSL_NO_DEPRECATED_3_0
    q_EVP_PKEY_free(pkey);
#endif

    return keyRaii.release();
}